

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

base_learner * bfgs_setup(options_i *options,vw *all)

{
  uint32_t uVar1;
  pointer pbVar2;
  undefined8 uVar3;
  typed_option<float> *this;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<bfgs,_example> *l;
  stringstream __msg;
  option_group_definition bfgs_inner_options;
  option_group_definition bfgs_outer_options;
  bool bfgs_option;
  bool conjugate_gradient;
  free_ptr<bfgs> b;
  typed_option<float> *in_stack_fffffffffffff448;
  typed_option<float> *in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff458;
  float in_stack_fffffffffffff45c;
  typed_option<float> *in_stack_fffffffffffff460;
  string *in_stack_fffffffffffff468;
  learner<bfgs,_example> *in_stack_fffffffffffff470;
  int plineNumber;
  string *in_stack_fffffffffffff478;
  typed_option<unsigned_long> *in_stack_fffffffffffff480;
  typed_option<float> *in_stack_fffffffffffff498;
  vw *pvVar4;
  option_group_definition *in_stack_fffffffffffff4a0;
  size_t sVar5;
  stringstream local_a80 [16];
  ostream local_a70;
  allocator local_8f1;
  string local_8f0 [32];
  undefined4 local_8d0;
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [359];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [359];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [359];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  typed_option<bool> local_3d0 [2];
  allocator local_289;
  string local_288 [32];
  undefined1 local_268 [63];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<bool> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<bfgs>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"LBFGS and Conjugate Gradient options",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff450,
             (string *)in_stack_fffffffffffff448);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"conjugate_gradient",&local_201);
  VW::config::make_option<bool>
            ((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
             (bool *)in_stack_fffffffffffff450);
  VW::config::typed_option<bool>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"use conjugate gradient based optimization",&local_229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff450,(string *)in_stack_fffffffffffff448);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff450,
             (typed_option<bool> *)in_stack_fffffffffffff448);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff4a0,(typed_option<bool> *)in_stack_fffffffffffff498);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"LBFGS and Conjugate Gradient options",&local_289);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff450,
             (string *)in_stack_fffffffffffff448);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"bfgs",&local_3f1);
  VW::config::make_option<bool>
            ((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
             (bool *)in_stack_fffffffffffff450);
  VW::config::typed_option<bool>::keep(local_3d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"use conjugate gradient based optimization",&local_419);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff450,(string *)in_stack_fffffffffffff448);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff450,
             (typed_option<bool> *)in_stack_fffffffffffff448);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff4a0,(typed_option<bool> *)in_stack_fffffffffffff498);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"hessian_on",&local_581);
  VW::config::make_option<bool>
            ((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
             (bool *)in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"use second derivative in line search",&local_5a9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff450,(string *)in_stack_fffffffffffff448);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff450,
             (typed_option<bool> *)in_stack_fffffffffffff448);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff4a0,(typed_option<bool> *)in_stack_fffffffffffff498);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,"mem",&local_711);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2ac56b);
  VW::config::make_option<int>
            ((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
             (int *)in_stack_fffffffffffff450);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff460,(int)in_stack_fffffffffffff45c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"memory in bfgs",&local_739);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff450,(string *)in_stack_fffffffffffff448);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_fffffffffffff450,
             (typed_option<int> *)in_stack_fffffffffffff448);
  VW::config::option_group_definition::add<int>
            (in_stack_fffffffffffff4a0,(typed_option<int> *)in_stack_fffffffffffff498);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"termination",&local_8a1);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2ac6ad);
  VW::config::make_option<float>
            ((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
             (float *)in_stack_fffffffffffff450);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff460,in_stack_fffffffffffff45c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c8,"Termination threshold",&local_8c9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff450,(string *)in_stack_fffffffffffff448);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffff450,in_stack_fffffffffffff448)
  ;
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  (**(code **)*local_10)(local_10,local_68);
  if (((local_29 & 1) == 0) && ((**(code **)*local_10)(local_10,local_268), (local_2a & 1) == 0)) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pvVar4 = local_18;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd07);
    pbVar2->all = pvVar4;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd1c);
    pbVar2->wolfe1_bound = 0.01;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd36);
    pbVar2->first_hessian_on = true;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd4a);
    pbVar2->first_pass = true;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd5e);
    pbVar2->gradient_pass = true;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd72);
    pbVar2->preconditioner_pass = true;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acd86);
    pbVar2->backstep_on = false;
    sVar5 = local_18->numpasses;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acdae);
    pbVar2->final_pass = sVar5;
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acdc4);
    pbVar2->no_win_counter = 0;
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8f0,"early_terminate",&local_8f1);
      in_stack_fffffffffffff480 =
           VW::config::options_i::get_typed_option<unsigned_long>
                     ((options_i *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      in_stack_fffffffffffff478 =
           (string *)
           VW::config::typed_option<unsigned_long>::value
                     ((typed_option<unsigned_long> *)in_stack_fffffffffffff450);
      pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                         ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2ace71);
      pbVar2->early_stop_thres = (size_t)in_stack_fffffffffffff478;
      std::__cxx11::string::~string(local_8f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    }
    pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2aceef);
    if (pbVar2->m == 0) {
      local_18->hessian_on = true;
    }
    if ((local_18->quiet & 1U) == 0) {
      pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                         ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acf26);
      if (pbVar2->m < 1) {
        pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acf60);
        std::operator<<(&(pbVar2->all->trace_message).super_ostream,
                        "enabling conjugate gradient optimization via BFGS ");
      }
      else {
        pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acf39);
        std::operator<<(&(pbVar2->all->trace_message).super_ostream,
                        "enabling BFGS based optimization ");
      }
      if ((local_18->hessian_on & 1U) == 0) {
        pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acfd7);
        in_stack_fffffffffffff468 =
             (string *)
             std::operator<<(&(pbVar2->all->trace_message).super_ostream,
                             "**without** curvature calculation");
        std::ostream::operator<<(in_stack_fffffffffffff468,std::endl<char,std::char_traits<char>>);
      }
      else {
        pbVar2 = std::unique_ptr<bfgs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bfgs,_void_(*)(void_*)> *)0x2acf98);
        in_stack_fffffffffffff470 =
             (learner<bfgs,_example> *)
             std::operator<<(&(pbVar2->all->trace_message).super_ostream,
                             "with curvature calculation");
        std::ostream::operator<<(in_stack_fffffffffffff470,std::endl<char,std::char_traits<char>>);
      }
    }
    if ((local_18->numpasses < 2) && ((local_18->training & 1U) != 0)) {
      std::__cxx11::stringstream::stringstream(local_a80);
      plineNumber = (int)((ulong)in_stack_fffffffffffff470 >> 0x20);
      std::operator<<(&local_a70,"you must make at least 2 passes to use BFGS");
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478,
                 plineNumber,in_stack_fffffffffffff468);
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_18->bfgs = true;
    parameters::stride_shift
              ((parameters *)in_stack_fffffffffffff450,
               (uint32_t)((ulong)in_stack_fffffffffffff448 >> 0x20));
    uVar1 = parameters::stride((parameters *)in_stack_fffffffffffff448);
    this = (typed_option<float> *)
           LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                     ((free_ptr<bfgs> *)in_stack_fffffffffffff460,
                      (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                      CONCAT44(uVar1,in_stack_fffffffffffff458),
                      (_func_void_bfgs_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_fffffffffffff450,(size_t)in_stack_fffffffffffff448);
    in_stack_fffffffffffff450 = this;
    LEARNER::learner<bfgs,_example>::set_save_load((learner<bfgs,_example> *)this,save_load);
    LEARNER::learner<bfgs,_example>::set_init_driver
              (in_stack_fffffffffffff470,(_func_void_bfgs_ptr *)in_stack_fffffffffffff468);
    LEARNER::learner<bfgs,_example>::set_end_pass
              (in_stack_fffffffffffff470,(_func_void_bfgs_ptr *)in_stack_fffffffffffff468);
    LEARNER::learner<bfgs,_example>::set_finish
              (in_stack_fffffffffffff470,(_func_void_bfgs_ptr *)in_stack_fffffffffffff468);
    local_8 = LEARNER::make_base<bfgs,example>((learner<bfgs,_example> *)this);
  }
  local_8d0 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff450);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff450);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<bfgs,_void_(*)(void_*)> *)in_stack_fffffffffffff460);
  return local_8;
}

Assistant:

base_learner* bfgs_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<bfgs>();
  bool conjugate_gradient = false;
  bool bfgs_option = false;
  option_group_definition bfgs_outer_options("LBFGS and Conjugate Gradient options");
  bfgs_outer_options.add(
      make_option("conjugate_gradient", conjugate_gradient).keep().help("use conjugate gradient based optimization"));

  option_group_definition bfgs_inner_options("LBFGS and Conjugate Gradient options");
  bfgs_inner_options.add(make_option("bfgs", bfgs_option).keep().help("use conjugate gradient based optimization"));
  bfgs_inner_options.add(make_option("hessian_on", all.hessian_on).help("use second derivative in line search"));
  bfgs_inner_options.add(make_option("mem", b->m).default_value(15).help("memory in bfgs"));
  bfgs_inner_options.add(
      make_option("termination", b->rel_threshold).default_value(0.001f).help("Termination threshold"));

  options.add_and_parse(bfgs_outer_options);
  if (!conjugate_gradient)
  {
    options.add_and_parse(bfgs_inner_options);
    if (!bfgs_option)
    {
      return nullptr;
    }
  }

  b->all = &all;
  b->wolfe1_bound = 0.01;
  b->first_hessian_on = true;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  b->backstep_on = false;
  b->final_pass = all.numpasses;
  b->no_win_counter = 0;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (b->m == 0)
    all.hessian_on = true;

  if (!all.quiet)
  {
    if (b->m > 0)
      b->all->trace_message << "enabling BFGS based optimization ";
    else
      b->all->trace_message << "enabling conjugate gradient optimization via BFGS ";
    if (all.hessian_on)
      b->all->trace_message << "with curvature calculation" << endl;
    else
      b->all->trace_message << "**without** curvature calculation" << endl;
  }

  if (all.numpasses < 2 && all.training)
    THROW("you must make at least 2 passes to use BFGS");

  all.bfgs = true;
  all.weights.stride_shift(2);

  learner<bfgs, example>& l = init_learner(b, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_init_driver(init_driver);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}